

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O0

void slang::hash_combine<int,int,unsigned_long>(size_t *seed,int *v,int rest,unsigned_long rest_1)

{
  uint64_t uVar1;
  hash<int,_void> *in_RCX;
  undefined4 in_EDX;
  size_t *in_RSI;
  ulong *in_RDI;
  hash<int,_void> hasher;
  int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = hash<int,_void>::operator()(in_RCX,in_stack_ffffffffffffffd8);
  *in_RDI = uVar1 + 0x9e3779b9 + *in_RDI * 0x40 + (*in_RDI >> 2) ^ *in_RDI;
  hash_combine<int,unsigned_long>
            (in_RSI,(int *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(unsigned_long)in_RCX);
  return;
}

Assistant:

inline void hash_combine(size_t& seed, const T& v, Rest... rest) {
    hash<T> hasher;
    seed ^= hasher(v) + 0x9e3779b9 + (seed << 6) + (seed >> 2);
    hash_combine(seed, rest...);
}